

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O3

void __thiscall
Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::create_expansion<false>
          (Simplex_tree<Gudhi::Simplex_tree_options_default> *this,Siblings *siblings,
          Dictionary_it *s_h,Dictionary_it *next,Filtration_value *fil,int k,
          vector<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>_>_>
          *added_simplices)

{
  Siblings *pSVar1;
  stored_size_type sVar2;
  Siblings *siblings_00;
  long lVar3;
  pointer ppVar4;
  long *in_FS_OFFSET;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
  ret_val_1;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
  ret_val;
  flat_tree<boost::container::dtl::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>,_boost::container::dtl::select1st<int>,_std::less<int>,_boost::container::new_allocator<boost::container::dtl::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>_>
  local_60;
  Dictionary_const_it local_48;
  Dictionary_const_it local_40;
  Dictionary_const_it local_38;
  
  local_60.m_data.m_seq.m_holder.m_size._4_4_ = s_h->m_ptr->first;
  boost::container::dtl::
  flat_tree<boost::container::dtl::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>,_boost::container::dtl::select1st<int>,_std::less<int>,_boost::container::new_allocator<boost::container::dtl::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>_>
  ::find(&local_60,(key_type *)&(this->root_).members_);
  if ((char)in_FS_OFFSET[-1] == '\0') {
    create_expansion<false>();
  }
  pSVar1 = ((local_60.m_data.m_seq.m_holder.m_start)->second).children_;
  if (pSVar1->parent_ == (local_60.m_data.m_seq.m_holder.m_start)->first) {
    lVar3 = *in_FS_OFFSET;
    local_38.m_ptr = next->m_ptr;
    local_40.m_ptr =
         (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
          *)((siblings->members_).m_flat_tree.m_data.m_seq.m_holder.m_start +
            (siblings->members_).m_flat_tree.m_data.m_seq.m_holder.m_size);
    local_48.m_ptr =
         (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
          *)(pSVar1->members_).m_flat_tree.m_data.m_seq.m_holder.m_start;
    local_60.m_data.m_seq.m_holder.m_capacity =
         (stored_size_type)
         ((pointer)local_48.m_ptr + (pSVar1->members_).m_flat_tree.m_data.m_seq.m_holder.m_size);
    intersection<false>((vector<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>,_std::allocator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>_>
                         *)(lVar3 + -0x20),&local_38,&local_40,&local_48,
                        (Dictionary_const_it *)&local_60.m_data.m_seq.m_holder.m_capacity,fil);
    if (in_FS_OFFSET[-3] == in_FS_OFFSET[-4]) {
      (s_h->m_ptr->second).children_ = siblings;
    }
    else {
      siblings_00 = (Siblings *)operator_new(0x28);
      Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,boost::container::flat_map<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>,std::less<int>,void>>
      ::
      Simplex_tree_siblings<std::vector<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>,std::allocator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>>>>
                ((Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,boost::container::flat_map<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>,std::less<int>,void>>
                  *)siblings_00,siblings,s_h->m_ptr->first,
                 (vector<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>,_std::allocator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>_>
                  *)(lVar3 + -0x20));
      sVar2 = (siblings_00->members_).m_flat_tree.m_data.m_seq.m_holder.m_size;
      if (sVar2 != 0) {
        ppVar4 = (siblings_00->members_).m_flat_tree.m_data.m_seq.m_holder.m_start;
        lVar3 = sVar2 << 5;
        do {
          if (ppVar4 == (pointer)0x0) {
            __assert_fail("!!m_ptr","/usr/include/boost/container/vector.hpp",0x98,
                          "vec_iterator<Pointer, IsConst> &boost::container::vec_iterator<std::pair<int, Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<>>> *, false>::operator++() [Pointer = std::pair<int, Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<>>> *, IsConst = false]"
                         );
          }
          ppVar4 = ppVar4 + 1;
          lVar3 = lVar3 + -0x20;
        } while (lVar3 != 0);
      }
      if (in_FS_OFFSET[-3] != in_FS_OFFSET[-4]) {
        in_FS_OFFSET[-3] = in_FS_OFFSET[-4];
      }
      (s_h->m_ptr->second).children_ = siblings_00;
      siblings_expansion(this,siblings_00,k + -1);
    }
  }
  return;
}

Assistant:

void create_expansion(Siblings * siblings,
                        Dictionary_it& s_h,
                        Dictionary_it& next,
                        const Filtration_value& fil,
                        int k,
                        std::vector<Simplex_handle>* added_simplices = nullptr)
  {
    Simplex_handle root_sh = find_vertex(s_h->first);
    thread_local std::vector<std::pair<Vertex_handle, Node> > inter;

    if (!has_children(root_sh)) return;

    intersection<force_filtration_value>(
          inter,  // output intersection
          next,   // begin
          siblings->members().end(),  // end
          root_sh->second.children()->members().begin(),
          root_sh->second.children()->members().end(),
          fil);
    if (inter.size() != 0) {
      Siblings * new_sib = new Siblings(siblings,   // oncles
                                        s_h->first, // parent
                                        inter);     // boost::container::ordered_unique_range_t
      for (auto it = new_sib->members().begin(); it != new_sib->members().end(); ++it) {
        update_simplex_tree_after_node_insertion(it);
        if constexpr (force_filtration_value){
          //the way create_expansion is used, added_simplices != nullptr when force_filtration_value == true
          added_simplices->push_back(it);
        }
      }
      inter.clear();
      s_h->second.assign_children(new_sib);
      if constexpr (force_filtration_value){
        siblings_expansion(new_sib, fil, k - 1, *added_simplices);
      } else {
        siblings_expansion(new_sib, k - 1);
      }
    } else {
      // ensure the children property
      s_h->second.assign_children(siblings);
      inter.clear();
    }
  }